

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
          (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *__return_storage_ptr__,
          PrimVar *var)

{
  undefined1 uVar1;
  vtable_type *pvVar2;
  pointer pSVar3;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  TimeSamples *this;
  ulong uVar7;
  long lVar8;
  Animatable<tinyusdz::value::normal3f> dst;
  optional<tinyusdz::value::normal3f> pv;
  undefined6 local_90;
  undefined2 uStack_8a;
  undefined4 local_88;
  undefined2 local_84;
  TypedTimeSamples<tinyusdz::value::normal3f> TStack_80;
  optional<tinyusdz::value::normal3f> oStack_60;
  optional<tinyusdz::value::normal3f> local_50;
  storage_t<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *local_40;
  TimeSamples *local_38;
  
  TStack_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  TStack_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  TStack_80._dirty = false;
  TStack_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  TStack_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  TStack_80._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_90 = 0;
  uStack_8a = 0;
  local_88 = 0;
  local_84 = 0;
  bVar4 = primvar::PrimVar::is_valid(var);
  if (bVar4) {
    if ((var->_blocked == false) &&
       (((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 0)) ||
        ((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 1)))))) {
      cVar5 = '\0';
    }
    else {
      primvar::PrimVar::get_value<tinyusdz::value::normal3f>(&local_50,var);
      cVar5 = local_50.has_value_;
      if (local_50.has_value_ == true) {
        oStack_60.contained._7_4_ = local_50.contained._8_4_;
        oStack_60._3_1_ = SUB81(local_50.contained._0_8_,0);
        oStack_60.contained._0_7_ = (undefined7)((ulong)local_50.contained._0_8_ >> 8);
        local_90 = (undefined6)local_50.contained._0_8_;
        uStack_8a = (undefined2)((ulong)local_50.contained._0_8_ >> 0x30);
        local_88 = local_50.contained._8_4_;
        local_84 = 1;
      }
    }
    if ((var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (cVar5 == '\0') goto LAB_0025c110;
    }
    else {
      uVar1 = __return_storage_ptr__->has_value_;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this = &var->_ts;
        local_40 = &__return_storage_ptr__->contained;
        lVar8 = 0;
        uVar7 = 0;
        local_38 = this;
        do {
          if ((var->_ts)._dirty == true) {
            tinyusdz::value::TimeSamples::update(this);
          }
          pSVar3 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((&pSVar3->blocked)[lVar8] == true) {
            TypedTimeSamples<tinyusdz::value::normal3f>::add_blocked_sample
                      (&TStack_80,*(double *)((long)&pSVar3->t + lVar8));
          }
          else {
            tinyusdz::value::Value::get_value<tinyusdz::value::normal3f>
                      (&oStack_60,(Value *)((long)&(pSVar3->value).v_.storage + lVar8),false);
            bVar4 = oStack_60.has_value_;
            local_50.has_value_ = oStack_60.has_value_;
            if (oStack_60.has_value_ == true) {
              local_50.contained._8_4_ =
                   CONCAT13(oStack_60.contained._11_1_,oStack_60.contained._8_3_);
              local_50.contained._0_8_ =
                   CONCAT17(oStack_60.contained._7_1_,oStack_60.contained._0_7_);
              TypedTimeSamples<tinyusdz::value::normal3f>::add_sample
                        (&TStack_80,*(double *)((long)&pSVar3->t + lVar8),
                         (normal3f *)&local_50.contained);
            }
            else {
              *(undefined8 *)((long)local_40 + 0x20) = 0;
              *(undefined8 *)((long)local_40 + 0x28) = 0;
              *(undefined8 *)((long)local_40 + 0x10) = 0;
              *(undefined8 *)((long)local_40 + 0x18) = 0;
              *(undefined8 *)local_40 = 0;
              *(undefined8 *)((long)local_40 + 8) = 0;
              uVar1 = false;
            }
            this = local_38;
            if (bVar4 == false) {
              __return_storage_ptr__->has_value_ = (bool)uVar1;
              goto LAB_0025c122;
            }
          }
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x28;
        } while (uVar7 < (ulong)(((long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x3333333333333333));
      }
      __return_storage_ptr__->has_value_ = (bool)uVar1;
    }
    __return_storage_ptr__->has_value_ = true;
    *(ulong *)&__return_storage_ptr__->contained = CONCAT26(uStack_8a,local_90);
    *(ulong *)((long)&__return_storage_ptr__->contained + 6) =
         CONCAT26(local_84,CONCAT42(local_88,uStack_8a));
    *(pointer *)((long)&__return_storage_ptr__->contained + 0x10) =
         TStack_80._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT71(TStack_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  TStack_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x20) =
         CONCAT71(TStack_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                  TStack_80._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    TStack_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    TStack_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    TStack_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    TStack_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    TStack_80._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    *(bool *)((long)&__return_storage_ptr__->contained + 0x28) = TStack_80._dirty;
  }
  else {
LAB_0025c110:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  }
LAB_0025c122:
  if (TStack_80._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(TStack_80._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(TStack_80._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             TStack_80._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)TStack_80._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}